

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__start_callbacks(stbi__context *s,stbi_io_callbacks *c,void *user)

{
  void *user_local;
  stbi_io_callbacks *c_local;
  stbi__context *s_local;
  
  (s->io).read = c->read;
  (s->io).skip = c->skip;
  (s->io).eof = c->eof;
  s->io_user_data = user;
  s->buflen = 0x80;
  s->read_from_callbacks = 1;
  s->img_buffer_original = s->buffer_start;
  stbi__refill_buffer(s);
  s->img_buffer_original_end = s->img_buffer_end;
  return;
}

Assistant:

static void stbi__start_callbacks(stbi__context *s, stbi_io_callbacks *c, void *user)
{
   s->io = *c;
   s->io_user_data = user;
   s->buflen = sizeof(s->buffer_start);
   s->read_from_callbacks = 1;
   s->img_buffer_original = s->buffer_start;
   stbi__refill_buffer(s);
   s->img_buffer_original_end = s->img_buffer_end;
}